

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_target(t_parser *this,bool a_assignable)

{
  t_at *ptVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  size_t *psVar4;
  pointer *ppptVar5;
  anon_union_8_3_60b33e96_for_t_lexer_12 aVar6;
  vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_> *this_00;
  tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *ptVar7;
  tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *ptVar8;
  wstring_view a_value;
  wstring_view a_value_00;
  wstring_view a_value_01;
  wstring_view a_value_02;
  bool bVar9;
  byte bVar10;
  t_token tVar11;
  long lVar12;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> _Var13;
  t_variable *ptVar14;
  t_script *ptVar15;
  undefined8 *puVar16;
  t_object *ptVar17;
  undefined8 *puVar18;
  t_object *ptVar19;
  t_lambda *this_01;
  _Base_ptr p_Var20;
  char cVar21;
  undefined **ppuVar22;
  _Base_ptr p_Var23;
  _Base_ptr p_Var24;
  char in_DL;
  wchar_t *pwVar25;
  ulong uVar26;
  pointer *__ptr;
  undefined7 in_register_00000031;
  t_parser *this_02;
  iterator iVar27;
  size_t sVar28;
  t_parser *this_03;
  _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
  *this_04;
  t_scope *ptVar29;
  long lVar30;
  char *pcVar31;
  tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *ptVar32;
  long in_FS_OFFSET;
  wstring_view a_message;
  wstring_view a_message_00;
  wstring_view a_message_01;
  wstring_view a_message_02;
  wstring_view a_message_03;
  wstring_view a_message_04;
  wstring_view a_message_05;
  pair<std::_Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>,_bool>
  pVar33;
  t_object *symbol;
  t_at at;
  t_script *in_stack_ffffffffffffff58;
  undefined1 local_98 [32];
  t_at local_78;
  t_lexer *local_60;
  _Head_base<0UL,_xemmai::ast::t_node_*,_false> local_58;
  wchar_t *local_50;
  vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>> *local_48;
  t_object *local_40;
  t_object *local_38;
  
  this_02 = (t_parser *)CONCAT71(in_register_00000031,a_assignable);
  local_78.v_column = (this_02->v_lexer).v_at.v_column;
  local_78.v_position = (this_02->v_lexer).v_at.v_position;
  local_78.v_line = (this_02->v_lexer).v_at.v_line;
  tVar11 = (this_02->v_lexer).v_token;
  if (0x2c < tVar11 - c_token__APOSTROPHE) {
switchD_001676c6_caseD_6:
    pwVar25 = L"unexpected token.";
    sVar28 = 0x11;
LAB_001687e1:
    a_message._M_str = pwVar25;
    a_message._M_len = sVar28;
    f_throw(this_02,a_message);
  }
  this_03 = (t_parser *)&this_02->v_lexer;
  ptVar1 = &(this_02->v_lexer).v_at;
  local_58._M_head_impl = (t_node *)this;
  switch(tVar11) {
  case c_token__APOSTROPHE:
    t_lexer::f_next((t_lexer *)this_03);
    tVar11 = (this_02->v_lexer).v_token;
    if (tVar11 == c_token__LEFT_PARENTHESIS) {
      pwVar25 = (this_02->v_lexer).v_indent.v_i;
      ptVar17 = (this_02->v_lexer).v_indent.v_p;
      t_lexer::f_next((t_lexer *)this_03);
      ptVar19 = t_script::f_slot(this_02->v_module,
                                 (t_object *)
                                 (*(long *)(*(long *)(in_FS_OFFSET + -0x78) + 0x1a8) + -0x48));
      puVar18 = (undefined8 *)operator_new(0x28);
      puVar18[1] = local_78.v_position;
      puVar18[2] = local_78.v_line;
      puVar18[3] = local_78.v_column;
      *puVar18 = &PTR__t_node_0019ba30;
      puVar18[4] = ptVar19;
      ptVar15 = (t_script *)operator_new(0x48);
      uVar26 = (long)pwVar25 + (-0x50 - (long)ptVar17);
      (ptVar15->v_path).field_2._M_allocated_capacity = local_78.v_column;
      (ptVar15->v_path)._M_dataplus._M_p = (pointer)local_78.v_position;
      (ptVar15->v_path)._M_string_length = local_78.v_line;
      (ptVar15->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_call_0019b298;
      *(undefined8 **)((long)&(ptVar15->v_path).field_2 + 8) = puVar18;
      (ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      (ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
      super__Deque_impl_data._M_map_size = 0;
      *(undefined8 *)
       ((long)&(ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>
               ._M_impl.super__Deque_impl_data._M_map_size + 1) = 0;
      *(undefined8 *)
       ((long)&(ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur + 1) = 0;
      bVar10 = (this_02->v_lexer).v_newline;
      if ((((bool)bVar10 != true) ||
          (uVar26 < (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                           (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)))) &&
         ((this_02->v_lexer).v_token != c_token__RIGHT_PARENTHESIS)) {
        bVar9 = f_expressions(this_02,(long)uVar26 >> 2,
                              (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                               *)&ptVar15->v_slots);
        *(bool *)&(ptVar15->v_slots).
                  super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first = bVar9;
        bVar10 = (this_02->v_lexer).v_newline;
      }
      if ((((bVar10 & 1) == 0) ||
          (uVar26 <= (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                            (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)))) &&
         ((this_02->v_lexer).v_token == c_token__RIGHT_PARENTHESIS)) {
        t_lexer::f_next((t_lexer *)this_03);
      }
      goto LAB_0016820e;
    }
    if (tVar11 != c_token__SYMBOL) {
      pwVar25 = L"expecting symbol or \'(\'.";
      goto LAB_0016888f;
    }
    ptVar15 = this_02->v_module;
    a_value_00._M_str = (wchar_t *)in_stack_ffffffffffffff58;
    a_value_00._M_len = 0x167ce1;
    ptVar17 = t_symbol::f_instantiate(a_value_00);
    ptVar17 = t_script::f_slot(ptVar15,ptVar17);
    t_lexer::f_next((t_lexer *)this_03);
    goto LAB_00167cf7;
  case c_token__LEFT_PARENTHESIS:
    t_lexer::f_next((t_lexer *)this_03);
    f_expression(this);
    if ((this_02->v_lexer).v_token == c_token__RIGHT_PARENTHESIS) {
      t_lexer::f_next((t_lexer *)this_03);
      return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)this;
    }
    a_message_03._M_str = L"expecting \')\'.";
    a_message_03._M_len = 0xe;
    f_throw(this_02,a_message_03);
  default:
    goto switchD_001676c6_caseD_6;
  case c_token__COLON:
  case c_token__SYMBOL:
  case c_token__SELF:
    ptVar29 = this_02->v_scope;
    if (tVar11 == c_token__COLON) {
      lVar30 = (this_02->v_lexer).field_11.v_integer;
      for (lVar12 = lVar30; lVar12 != 0; lVar12 = lVar12 + -1) {
        if (ptVar29 == (t_scope *)0x0) goto LAB_001687d5;
        ptVar29 = ptVar29->v_outer;
      }
      t_lexer::f_next((t_lexer *)this_03);
      tVar11 = (this_02->v_lexer).v_token;
    }
    else {
      lVar30 = 0;
    }
    if (tVar11 == c_token__SELF) {
      if (ptVar29 != (t_scope *)0x0) {
        if (lVar30 != 0) {
          ptVar29->v_self_shared = true;
        }
        local_60 = (t_lexer *)this_03;
        puVar16 = (undefined8 *)operator_new(0x28);
        puVar16[1] = local_78.v_position;
        puVar16[2] = local_78.v_line;
        puVar16[3] = local_78.v_column;
        *puVar16 = &PTR__t_node_0019b0e8;
        puVar16[4] = lVar30;
        pwVar25 = (this_02->v_lexer).v_value.v_i;
        for (pcVar31 = ((this_02->v_lexer).v_value.v_p)->v_data + 8; (wchar_t *)pcVar31 != pwVar25;
            pcVar31 = pcVar31 + 4) {
          if (*(int *)pcVar31 == 0x40) {
            puVar18 = (undefined8 *)operator_new(0x28);
            puVar18[3] = local_78.v_column;
            puVar18[1] = local_78.v_position;
            puVar18[2] = local_78.v_line;
            ppuVar22 = &PTR__t_class_0019b130;
          }
          else {
            puVar18 = (undefined8 *)operator_new(0x28);
            puVar18[3] = local_78.v_column;
            puVar18[1] = local_78.v_position;
            puVar18[2] = local_78.v_line;
            ppuVar22 = &PTR__t_super_0019b178;
          }
          *puVar18 = ppuVar22;
          puVar18[4] = puVar16;
          puVar16 = puVar18;
        }
        t_lexer::f_next(local_60);
        this = (t_parser *)local_58._M_head_impl;
        if (((this_02->v_lexer).v_newline == false) &&
           ((this_02->v_lexer).v_token == c_token__SYMBOL)) {
          local_98._16_8_ = (this_02->v_lexer).v_at.v_column;
          local_98._0_8_ = ptVar1->v_position;
          local_98._8_8_ = (this_02->v_lexer).v_at.v_line;
          ptVar15 = this_02->v_module;
          a_value_02._M_str = (wchar_t *)in_stack_ffffffffffffff58;
          a_value_02._M_len = 0x16807c;
          ptVar17 = t_symbol::f_instantiate(a_value_02);
          ptVar17 = t_script::f_slot(ptVar15,ptVar17);
          t_lexer::f_next(local_60);
          if ((this_02->v_lexer).v_token == c_token__EQUAL) {
            if (in_DL == '\0') {
              a_message_04._M_str = L"can not assign to expression.";
              a_message_04._M_len = 0x1d;
              f_throw(this_02,a_message_04);
            }
            t_lexer::f_next(local_60);
            f_expression((t_parser *)&stack0xffffffffffffff58);
            puVar18 = (undefined8 *)operator_new(0x38);
            puVar18[3] = local_98._16_8_;
            ((tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)
            (puVar18 + 1))->
            super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
                 = (_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
                    )local_98._0_8_;
            puVar18[2] = local_98._8_8_;
            *puVar18 = &PTR__t_object_put_0019af50;
            puVar18[4] = puVar16;
            puVar18[5] = ptVar17;
            puVar18[6] = in_stack_ffffffffffffff58;
          }
          else {
            puVar18 = (undefined8 *)operator_new(0x30);
            puVar18[3] = local_98._16_8_;
            ((_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)
            (puVar18 + 1))->super__Head_base<0UL,_xemmai::ast::t_node_*,_false> =
                 (_Head_base<0UL,_xemmai::ast::t_node_*,_false>)local_98._0_8_;
            puVar18[2] = local_98._8_8_;
            *puVar18 = &PTR__t_object_get_0019aed8;
            puVar18[4] = puVar16;
            puVar18[5] = ptVar17;
          }
          goto LAB_0016827a;
        }
        goto LAB_001683cf;
      }
    }
    else {
      if (tVar11 != c_token__SYMBOL) {
        pwVar25 = L"expecting symbol or self.";
        sVar28 = 0x19;
        goto LAB_001687e1;
      }
      ptVar15 = this_02->v_module;
      a_value._M_str = (wchar_t *)in_stack_ffffffffffffff58;
      a_value._M_len = 0x167749;
      ptVar17 = t_symbol::f_instantiate(a_value);
      _Var13._M_head_impl = (t_node *)t_script::f_slot(ptVar15,ptVar17);
      local_98._0_8_ = _Var13._M_head_impl;
      t_lexer::f_next((t_lexer *)this_03);
      if ((this_02->v_lexer).v_token != c_token__EQUAL) {
        if (ptVar29 != (t_scope *)0x0) {
          this_04 = (_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                     *)&ptVar29->v_unresolveds;
          if (lVar30 == 0) {
            this_04 = (_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                       *)&ptVar29->v_references;
          }
          std::
          _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
          ::_M_insert_unique<xemmai::t_object*const&>(this_04,(t_object **)local_98);
          _Var13._M_head_impl = (t_node *)local_98._0_8_;
        }
        ptVar15 = (t_script *)operator_new(0x48);
        (ptVar15->v_path)._M_dataplus._M_p = (pointer)local_78.v_position;
        (ptVar15->v_path)._M_string_length = local_78.v_line;
        (ptVar15->v_path).field_2._M_allocated_capacity = local_78.v_column;
        (ptVar15->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_node_0019b070;
        *(long *)((long)&(ptVar15->v_path).field_2 + 8) = lVar30;
        (ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
        _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)ptVar29;
        (ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
        _M_impl.super__Deque_impl_data._M_map_size = (size_t)_Var13._M_head_impl;
        (ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
        _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
LAB_00168013:
        this->v_module = ptVar15;
        return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)this;
      }
      if (in_DL == '\0') {
        pwVar25 = L"can not assign to expression.";
        sVar28 = 0x1d;
        goto LAB_001687e1;
      }
      if (ptVar29 != (t_scope *)0x0) {
        t_lexer::f_next((t_lexer *)this_03);
        ptVar14 = f_variable(this_03,ptVar29,(t_object *)_Var13._M_head_impl);
        if (lVar30 != 0) {
          ptVar14->v_shared = true;
          ptVar14->v_varies = true;
        }
        f_expression((t_parser *)&stack0xffffffffffffff58);
        ptVar15 = (t_script *)operator_new(0x38);
        (ptVar15->v_path).field_2._M_allocated_capacity = local_78.v_column;
        (ptVar15->v_path)._M_dataplus._M_p = (pointer)local_78.v_position;
        (ptVar15->v_path)._M_string_length = local_78.v_line;
        (ptVar15->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_scope_put_0019b0a0;
        *(long *)((long)&(ptVar15->v_path).field_2 + 8) = lVar30;
        (ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
        _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)ptVar14;
        (ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
        _M_impl.super__Deque_impl_data._M_map_size = (size_t)in_stack_ffffffffffffff58;
        goto LAB_00168013;
      }
    }
LAB_001687d5:
    pwVar25 = L"no more outer scope.";
    sVar28 = 0x14;
    goto LAB_001687e1;
  case c_token__ATMARK:
    pwVar25 = (this_02->v_lexer).v_indent.v_i;
    ptVar17 = (this_02->v_lexer).v_indent.v_p;
    t_lexer::f_next((t_lexer *)this_03);
    this_01 = (t_lambda *)operator_new(0x1d0);
    ast::t_lambda::t_lambda(this_01,&local_78,this_02->v_scope);
    bVar10 = (this_02->v_lexer).v_newline;
    if (((bool)bVar10 == false) && ((this_02->v_lexer).v_token == c_token__LEFT_PARENTHESIS)) {
      t_lexer::f_next((t_lexer *)this_03);
      tVar11 = (this_02->v_lexer).v_token;
      if (tVar11 != c_token__RIGHT_PARENTHESIS) {
        local_48 = (vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>
                    *)&(this_01->super_t_scope).v_privates;
        local_60 = (t_lexer *)&(this_01->super_t_scope).v_variables;
        local_38 = (t_object *)&this_01->v_defaults;
        local_50 = L"expecting symbol or \'*\'.";
LAB_00167eb2:
        do {
          if (tVar11 != c_token__SYMBOL) {
            if (tVar11 != c_token__ASTERISK) {
              sVar28 = 0x18;
              goto LAB_0016882e;
            }
            t_lexer::f_next((t_lexer *)this_03);
            if ((this_02->v_lexer).v_token != c_token__SYMBOL) {
              local_50 = L"expecting symbol.";
              sVar28 = 0x11;
              goto LAB_0016882e;
            }
            local_40 = f_symbol(this_02);
            local_98._0_8_ =
                 (__uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)
                 0x0;
            local_98._8_8_ = 0;
            std::
            _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
            ::_M_emplace_unique<xemmai::t_object*,xemmai::t_code::t_variable>
                      ((_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                        *)local_60,&local_40,(t_variable *)local_98);
            std::vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>::
            emplace_back<xemmai::t_code::t_variable*>
                      (local_48,(t_variable **)&stack0xffffffffffffff58);
            this_01->v_variadic = true;
            t_lexer::f_next((t_lexer *)this_03);
            tVar11 = (this_02->v_lexer).v_token;
LAB_00168447:
            if (tVar11 != c_token__RIGHT_PARENTHESIS) {
              local_50 = L"expecting \')\'.";
              sVar28 = 0xe;
LAB_0016882e:
              a_message_02._M_str = local_50;
              a_message_02._M_len = sVar28;
              f_throw(this_02,a_message_02);
            }
            break;
          }
          ptVar15 = this_02->v_module;
          a_value_01._M_str = (wchar_t *)in_stack_ffffffffffffff58;
          a_value_01._M_len = 0x167edc;
          ptVar19 = t_symbol::f_instantiate(a_value_01);
          local_40 = t_script::f_slot(ptVar15,ptVar19);
          local_98._0_8_ =
               (_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)
               0x0;
          local_98._8_8_ = 0;
          pVar33 = std::
                   _Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                   ::_M_emplace_unique<xemmai::t_object*,xemmai::t_code::t_variable>
                             ((_Rb_tree<xemmai::t_object*,std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>,std::_Select1st<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>,std::less<xemmai::t_object*>,std::allocator<std::pair<xemmai::t_object*const,xemmai::t_code::t_variable>>>
                               *)local_60,&local_40,(t_variable *)local_98);
          in_stack_ffffffffffffff58 = (t_script *)&pVar33.first._M_node._M_node[1]._M_parent;
          std::vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>::
          emplace_back<xemmai::t_code::t_variable*>
                    (local_48,(t_variable **)&stack0xffffffffffffff58);
          t_lexer::f_next((t_lexer *)this_03);
          tVar11 = (this_02->v_lexer).v_token;
          if (tVar11 == c_token__EQUAL) {
            t_lexer::f_next((t_lexer *)this_03);
            f_expression((t_parser *)local_98);
            std::
            vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
            ::
            emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                      ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                        *)local_38,
                       (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *
                       )local_98);
            if ((t_node *)local_98._0_8_ != (t_node *)0x0) {
              (**(code **)(*(long *)local_98._0_8_ + 8))();
            }
            tVar11 = (this_02->v_lexer).v_token;
          }
          else if ((this_01->v_defaults).
                   super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish !=
                   (this_01->v_defaults).
                   super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
            sVar28 = 0xe;
            local_50 = L"expecting \'=\'.";
            goto LAB_0016882e;
          }
          if ((this_02->v_lexer).v_newline != true) {
            if (tVar11 != c_token__COMMA) goto LAB_00168447;
            t_lexer::f_next((t_lexer *)this_03);
            tVar11 = (this_02->v_lexer).v_token;
            goto LAB_00167eb2;
          }
        } while (tVar11 != c_token__RIGHT_PARENTHESIS);
      }
      t_lexer::f_next((t_lexer *)this_03);
      bVar10 = (this_02->v_lexer).v_newline;
    }
    uVar26 = (long)pwVar25 + (-0x50 - (long)ptVar17);
    this_01->v_arguments =
         (this_01->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header._M_node_count;
    this_02->v_scope->v_shared = true;
    ptVar29 = &this_01->super_t_scope;
    this_02->v_scope = ptVar29;
    local_48 = (vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>> *)
               CONCAT71(local_48._1_7_,this_02->v_can_return);
    this_02->v_can_return = true;
    local_60 = (t_lexer *)CONCAT71(local_60._1_7_,this_02->v_can_jump);
    if ((bVar10 & 1) == 0) {
      f_expression((t_parser *)local_98);
      std::
      vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
      ::emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                  *)&(this_01->super_t_scope).v_block,
                 (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
                 local_98);
      if ((t_script *)local_98._0_8_ != (t_script *)0x0) {
        (*(code *)((t_object *)((t_body *)local_98._0_8_)->_vptr_t_body)->v_previous)();
      }
      if (((this_02->v_lexer).v_newline == true) &&
         (uVar26 < (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)))) {
        a_message_05._M_str = L"unexpected indent.";
        a_message_05._M_len = 0x12;
        f_throw(this_02,a_message_05);
      }
    }
    else if (uVar26 < (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                             (-0x50 - (long)(this_02->v_lexer).v_indent.v_p))) {
      f_block(this_02,&(this_01->super_t_scope).v_block);
    }
    p_Var20 = (this_01->super_t_scope).v_unresolveds._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    p_Var2 = &(this_01->super_t_scope).v_unresolveds._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var20 != p_Var2) {
      p_Var3 = &(this_01->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header;
      do {
        local_98._0_8_ = *(undefined8 *)(p_Var20 + 1);
        p_Var24 = (this_01->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        p_Var23 = &p_Var3->_M_header;
        if (p_Var24 == (_Base_ptr)0x0) {
LAB_00168582:
          std::
          _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
          ::_M_insert_unique<xemmai::t_object*const&>
                    ((_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                      *)&ptVar29->v_outer->v_unresolveds,(t_object **)local_98);
        }
        else {
          do {
            if (*(t_script **)(p_Var24 + 1) >= (ulong)local_98._0_8_) {
              p_Var23 = p_Var24;
            }
            p_Var24 = (&p_Var24->_M_left)[*(t_script **)(p_Var24 + 1) < (ulong)local_98._0_8_];
          } while (p_Var24 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var23 == p_Var3) ||
             ((ulong)local_98._0_8_ < *(t_script **)(p_Var23 + 1))) goto LAB_00168582;
          *(undefined1 *)&p_Var23[1]._M_parent = 1;
        }
        p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
      } while ((_Rb_tree_header *)p_Var20 != p_Var2);
    }
    p_Var20 = (this_01->super_t_scope).v_references._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    p_Var2 = &(this_01->super_t_scope).v_references._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var20 != p_Var2) {
      p_Var3 = &(this_01->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header;
      do {
        local_98._0_8_ = *(undefined8 *)(p_Var20 + 1);
        p_Var24 = (this_01->super_t_scope).v_variables._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        p_Var23 = &p_Var3->_M_header;
        if (p_Var24 == (_Base_ptr)0x0) {
LAB_00168606:
          std::
          _Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
          ::_M_insert_unique<xemmai::t_object*const&>
                    ((_Rb_tree<xemmai::t_object*,xemmai::t_object*,std::_Identity<xemmai::t_object*>,std::less<xemmai::t_object*>,std::allocator<xemmai::t_object*>>
                      *)&ptVar29->v_outer->v_unresolveds,(t_object **)local_98);
        }
        else {
          do {
            if (*(t_node **)(p_Var24 + 1) >= (ulong)local_98._0_8_) {
              p_Var23 = p_Var24;
            }
            p_Var24 = (&p_Var24->_M_left)[*(t_node **)(p_Var24 + 1) < (ulong)local_98._0_8_];
          } while (p_Var24 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var23 == p_Var3) ||
             ((ulong)local_98._0_8_ < *(t_node **)(p_Var23 + 1))) goto LAB_00168606;
        }
        p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
      } while ((_Rb_tree_header *)p_Var20 != p_Var2);
    }
    this_02->v_scope = (this_01->super_t_scope).v_outer;
    this_02->v_can_jump = local_60._0_1_;
    this_02->v_can_return = local_48._0_1_;
    ptVar7 = (tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)
             (this_01->super_t_scope).v_privates.
             super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ptVar8 = (tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)
             (this_01->super_t_scope).v_privates.
             super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_60 = (t_lexer *)
               (this_01->super_t_scope).v_privates.
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this_01->super_t_scope).v_privates.
    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_01->super_t_scope).v_privates.
    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_01->super_t_scope).v_privates.
    super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((this_01->super_t_scope).v_self_shared != false) {
      psVar4 = &(this_01->super_t_scope).v_shareds;
      *psVar4 = *psVar4 + 1;
    }
    this_00 = &(this_01->super_t_scope).v_privates;
    sVar28 = this_01->v_arguments;
    ptVar32 = ptVar7;
    if (sVar28 != 0) {
      ptVar32 = ptVar7 + sVar28;
      lVar30 = 0;
      do {
        local_98._0_8_ =
             ((__uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
             ((long)&ptVar7->
                     super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
             + lVar30))->_M_t;
        if (*(char *)local_98._0_8_ == '\x01') {
          iVar27._M_current =
               (this_01->super_t_scope).v_privates.
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          ptVar17 = (t_object *)(this_01->super_t_scope).v_shareds;
          (this_01->super_t_scope).v_shareds = (size_t)((long)&ptVar17->v_next + 1);
        }
        else {
          iVar27._M_current =
               (this_01->super_t_scope).v_privates.
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          ptVar17 = (t_object *)
                    ((long)iVar27._M_current -
                     (long)(this_01->super_t_scope).v_privates.
                           super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
        }
        (((wstring *)(local_98._0_8_ + 8))->_M_dataplus)._M_p = (pointer)ptVar17;
        if (iVar27._M_current ==
            (this_01->super_t_scope).v_privates.
            super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>::
          _M_realloc_insert<xemmai::t_code::t_variable*const&>
                    ((vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>
                      *)this_00,iVar27,(t_variable **)local_98);
        }
        else {
          *iVar27._M_current = (t_variable *)local_98._0_8_;
          ppptVar5 = &(this_01->super_t_scope).v_privates.
                      super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *ppptVar5 = *ppptVar5 + 1;
        }
        lVar30 = lVar30 + 8;
      } while (sVar28 << 3 != lVar30);
    }
    if (ptVar32 != ptVar8) {
      do {
        local_98._0_8_ =
             ptVar32->
             super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
        ;
        if (*(char *)local_98._0_8_ == '\x01') {
          ptVar17 = (t_object *)(this_01->super_t_scope).v_shareds;
          (this_01->super_t_scope).v_shareds = (size_t)((long)&ptVar17->v_next + 1);
          (((wstring *)(local_98._0_8_ + 8))->_M_dataplus)._M_p = (pointer)ptVar17;
        }
        else {
          iVar27._M_current =
               (this_01->super_t_scope).v_privates.
               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          (((wstring *)(local_98._0_8_ + 8))->_M_dataplus)._M_p =
               (pointer)((long)iVar27._M_current -
                         (long)(this_01->super_t_scope).v_privates.
                               super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3);
          if (iVar27._M_current ==
              (this_01->super_t_scope).v_privates.
              super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>::
            _M_realloc_insert<xemmai::t_code::t_variable*const&>
                      ((vector<xemmai::t_code::t_variable*,std::allocator<xemmai::t_code::t_variable*>>
                        *)this_00,iVar27,(t_variable **)local_98);
          }
          else {
            *iVar27._M_current = (t_variable *)local_98._0_8_;
            ppptVar5 = &(this_01->super_t_scope).v_privates.
                        super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *ppptVar5 = *ppptVar5 + 1;
          }
        }
        ptVar32 = ptVar32 + 1;
      } while (ptVar32 != ptVar8);
    }
    _Var13._M_head_impl = local_58._M_head_impl;
    (local_58._M_head_impl)->_vptr_t_node = (_func_int **)this_01;
    if (ptVar7 == (tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)0x0) {
      return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)
             local_58._M_head_impl;
    }
    operator_delete(ptVar7,(long)local_60 - (long)ptVar7);
    return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)
           _Var13._M_head_impl;
  case c_token__LEFT_BRACKET:
    pwVar25 = (this_02->v_lexer).v_indent.v_i;
    ptVar17 = (this_02->v_lexer).v_indent.v_p;
    t_lexer::f_next((t_lexer *)this_03);
    ptVar19 = t_script::f_slot(this_02->v_module,
                               (t_object *)
                               (*(long *)(*(long *)(in_FS_OFFSET + -0x78) + 0x1b8) + -0x48));
    puVar18 = (undefined8 *)operator_new(0x28);
    puVar18[1] = local_78.v_position;
    puVar18[2] = local_78.v_line;
    puVar18[3] = local_78.v_column;
    *puVar18 = &PTR__t_node_0019ba30;
    puVar18[4] = ptVar19;
    ptVar15 = (t_script *)operator_new(0x48);
    uVar26 = (long)pwVar25 + (-0x50 - (long)ptVar17);
    (ptVar15->v_path).field_2._M_allocated_capacity = local_78.v_column;
    (ptVar15->v_path)._M_dataplus._M_p = (pointer)local_78.v_position;
    (ptVar15->v_path)._M_string_length = local_78.v_line;
    (ptVar15->super_t_body)._vptr_t_body = (_func_int **)&PTR__t_call_0019b298;
    *(undefined8 **)((long)&(ptVar15->v_path).field_2 + 8) = puVar18;
    (ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    (ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    *(undefined8 *)
     ((long)&(ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
             _M_impl.super__Deque_impl_data._M_map_size + 1) = 0;
    *(undefined8 *)
     ((long)&(ptVar15->v_slots).super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur + 1) = 0;
    bVar10 = (this_02->v_lexer).v_newline;
    if ((((bool)bVar10 != true) ||
        (uVar26 < (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                         (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)))) &&
       ((this_02->v_lexer).v_token != c_token__RIGHT_BRACKET)) {
      bVar9 = f_expressions(this_02,(long)uVar26 >> 2,
                            (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                             *)&ptVar15->v_slots);
      *(bool *)&(ptVar15->v_slots).
                super__Deque_base<xemmai::t_slot,_std::allocator<xemmai::t_slot>_>._M_impl.
                super__Deque_impl_data._M_start._M_first = bVar9;
      bVar10 = (this_02->v_lexer).v_newline;
    }
    if ((((bVar10 & 1) == 0) ||
        (uVar26 <= (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                          (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)))) &&
       ((this_02->v_lexer).v_token == c_token__RIGHT_BRACKET)) {
      t_lexer::f_next((t_lexer *)this_03);
    }
LAB_0016820e:
    this->v_module = ptVar15;
    return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)this;
  case c_token__LEFT_BRACE:
    pwVar25 = (this_02->v_lexer).v_indent.v_i;
    ptVar17 = (this_02->v_lexer).v_indent.v_p;
    t_lexer::f_next((t_lexer *)this_03);
    ptVar19 = t_script::f_slot(this_02->v_module,
                               (t_object *)
                               (*(long *)(*(long *)(in_FS_OFFSET + -0x78) + 0x1d8) + -0x48));
    puVar18 = (undefined8 *)operator_new(0x28);
    puVar18[1] = local_78.v_position;
    puVar18[2] = local_78.v_line;
    puVar18[3] = local_78.v_column;
    *puVar18 = &PTR__t_node_0019ba30;
    puVar18[4] = ptVar19;
    puVar16 = (undefined8 *)operator_new(0x48);
    uVar26 = (long)pwVar25 + (-0x50 - (long)ptVar17);
    puVar16[3] = local_78.v_column;
    puVar16[1] = local_78.v_position;
    puVar16[2] = local_78.v_line;
    *puVar16 = &PTR__t_call_0019b298;
    puVar16[4] = puVar18;
    puVar16[5] = 0;
    puVar16[6] = 0;
    *(undefined8 *)((long)puVar16 + 0x31) = 0;
    *(undefined8 *)((long)puVar16 + 0x39) = 0;
    if ((this_02->v_lexer).v_newline == true) {
      tVar11 = (this_02->v_lexer).v_token;
      if (tVar11 == c_token__RIGHT_BRACE ||
          (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                 (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)) <= uVar26) {
        cVar21 = '\x01';
      }
      else {
LAB_0016829d:
        do {
          while( true ) {
            f_expression((t_parser *)local_98);
            std::
            vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
            ::
            emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                      ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                        *)(puVar16 + 5),
                       (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *
                       )local_98);
            if ((t_script *)local_98._0_8_ != (t_script *)0x0) {
              (*(code *)((t_object *)((t_body *)local_98._0_8_)->_vptr_t_body)->v_previous)();
            }
            if (((this_02->v_lexer).v_token != c_token__COLON) ||
               ((this_02->v_lexer).field_11.v_string != (t_object *)0x1)) {
              a_message_00._M_str = L"expecting \':\'.";
              a_message_00._M_len = 0xe;
              f_throw(this_02,a_message_00);
            }
            t_lexer::f_next((t_lexer *)this_03);
            f_expression((t_parser *)local_98);
            std::
            vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
            ::
            emplace_back<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>
                      ((vector<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>,std::allocator<std::unique_ptr<xemmai::ast::t_node,std::default_delete<xemmai::ast::t_node>>>>
                        *)(puVar16 + 5),
                       (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *
                       )local_98);
            if ((t_node *)local_98._0_8_ != (t_node *)0x0) {
              (**(code **)(*(long *)local_98._0_8_ + 8))();
            }
            tVar11 = (this_02->v_lexer).v_token;
            cVar21 = (this_02->v_lexer).v_newline;
            if (tVar11 != c_token__COMMA) break;
            if (((bool)cVar21 != false) &&
               ((ulong)((long)(this_02->v_lexer).v_indent.v_i +
                       (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)) < uVar26))
            goto LAB_001683cf;
            t_lexer::f_next((t_lexer *)this_03);
          }
        } while (((bool)cVar21 != false) &&
                (uVar26 < (ulong)((long)(this_02->v_lexer).v_indent.v_i +
                                 (-0x50 - (long)(this_02->v_lexer).v_indent.v_p))));
      }
      if (cVar21 == '\0') {
        if (tVar11 != c_token__RIGHT_BRACE) goto LAB_001683cf;
      }
      else if ((ulong)((long)(this_02->v_lexer).v_indent.v_i +
                      (-0x50 - (long)(this_02->v_lexer).v_indent.v_p)) < uVar26 ||
               tVar11 != c_token__RIGHT_BRACE) goto LAB_001683cf;
    }
    else if ((this_02->v_lexer).v_token != c_token__RIGHT_BRACE) goto LAB_0016829d;
    t_lexer::f_next((t_lexer *)this_03);
LAB_001683cf:
    (local_58._M_head_impl)->_vptr_t_node = puVar16;
    return (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>)
           local_58._M_head_impl;
  case c_token__NULL:
    t_lexer::f_next((t_lexer *)this_03);
    puVar18 = (undefined8 *)operator_new(0x20);
    puVar18[1] = local_78.v_position;
    puVar18[2] = local_78.v_line;
    puVar18[3] = local_78.v_column;
    ppuVar22 = &PTR__t_node_0019b1c0;
    break;
  case c_token__TRUE:
    t_lexer::f_next((t_lexer *)this_03);
    puVar18 = (undefined8 *)operator_new(0x28);
    puVar18[1] = local_78.v_position;
    puVar18[2] = local_78.v_line;
    puVar18[3] = local_78.v_column;
    puVar18[4] = 2;
    goto LAB_001679ad;
  case c_token__FALSE:
    t_lexer::f_next((t_lexer *)this_03);
    puVar18 = (undefined8 *)operator_new(0x28);
    puVar18[1] = local_78.v_position;
    puVar18[2] = local_78.v_line;
    puVar18[3] = local_78.v_column;
    puVar18[4] = 1;
LAB_001679ad:
    ppuVar22 = &PTR__t_node_0019b3f8;
    break;
  case c_token__INTEGER:
    aVar6 = (this_02->v_lexer).field_11;
    t_lexer::f_next((t_lexer *)this_03);
    puVar18 = (undefined8 *)operator_new(0x28);
    puVar18[1] = local_78.v_position;
    puVar18[2] = local_78.v_line;
    puVar18[3] = local_78.v_column;
    *puVar18 = &PTR__t_node_0019b458;
    *(anon_union_8_3_60b33e96_for_t_lexer_12 *)(puVar18 + 4) = aVar6;
    goto LAB_0016827a;
  case c_token__FLOAT:
    aVar6 = (this_02->v_lexer).field_11;
    t_lexer::f_next((t_lexer *)this_03);
    puVar18 = (undefined8 *)operator_new(0x28);
    puVar18[1] = local_78.v_position;
    puVar18[2] = local_78.v_line;
    puVar18[3] = local_78.v_column;
    *puVar18 = &PTR__t_node_0019b4a0;
    *(anon_union_8_3_60b33e96_for_t_lexer_12 *)(puVar18 + 4) = aVar6;
    goto LAB_0016827a;
  case c_token__STRING:
    ptVar17 = (this_02->v_lexer).field_11.v_string;
    t_lexer::f_next((t_lexer *)this_03);
    ptVar17 = t_script::f_slot(this_02->v_module,ptVar17);
LAB_00167cf7:
    puVar18 = (undefined8 *)operator_new(0x28);
    puVar18[1] = local_78.v_position;
    puVar18[2] = local_78.v_line;
    puVar18[3] = local_78.v_column;
    *puVar18 = &PTR__t_node_0019ba30;
    puVar18[4] = ptVar17;
    goto LAB_0016827a;
  case c_token__BREAK:
    local_98._16_8_ = (this_02->v_lexer).v_at.v_column;
    local_98._0_8_ = ptVar1->v_position;
    local_98._8_8_ = (this_02->v_lexer).v_at.v_line;
    if (this_02->v_can_jump == false) {
LAB_00168804:
      a_message_01._M_str = L"expecting inside loop.";
      a_message_01._M_len = 0x16;
      f_throw(this_02,a_message_01,(t_at *)local_98);
    }
    t_lexer::f_next((t_lexer *)this_03);
    if (((this_02->v_lexer).v_newline == false) && (6 < (this_02->v_lexer).v_token - c_token__IF)) {
      f_expression((t_parser *)&stack0xffffffffffffff58);
    }
    else {
      in_stack_ffffffffffffff58 = (t_script *)0x0;
    }
    puVar18 = (undefined8 *)operator_new(0x28);
    puVar18[3] = local_98._16_8_;
    ((_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)
    (puVar18 + 1))->super__Head_base<0UL,_xemmai::ast::t_node_*,_false> =
         (_Head_base<0UL,_xemmai::ast::t_node_*,_false>)local_98._0_8_;
    puVar18[2] = local_98._8_8_;
    ppuVar22 = &PTR__t_break_0019adb8;
    goto LAB_0016826f;
  case c_token__CONTINUE:
    local_98._16_8_ = (this_02->v_lexer).v_at.v_column;
    local_98._0_8_ = ptVar1->v_position;
    local_98._8_8_ = (this_02->v_lexer).v_at.v_line;
    if (this_02->v_can_jump == false) goto LAB_00168804;
    t_lexer::f_next((t_lexer *)this_03);
    puVar18 = (undefined8 *)operator_new(0x20);
    ((__uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
    (puVar18 + 1))->_M_t =
         (tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)local_98._0_8_;
    puVar18[2] = local_98._8_8_;
    puVar18[3] = local_98._16_8_;
    ppuVar22 = &PTR__t_node_0019ae00;
    break;
  case c_token__RETURN:
    if (this_02->v_can_return == false) {
      pwVar25 = L"expecting within lambda.";
LAB_0016888f:
      sVar28 = 0x18;
      goto LAB_001687e1;
    }
    local_98._16_8_ = (this_02->v_lexer).v_at.v_column;
    local_98._0_8_ = ptVar1->v_position;
    local_98._8_8_ = (this_02->v_lexer).v_at.v_line;
    t_lexer::f_next((t_lexer *)this_03);
    if (((this_02->v_lexer).v_newline == false) && (6 < (this_02->v_lexer).v_token - c_token__IF)) {
      f_expression((t_parser *)&stack0xffffffffffffff58);
    }
    else {
      in_stack_ffffffffffffff58 = (t_script *)0x0;
    }
    puVar18 = (undefined8 *)operator_new(0x28);
    puVar18[3] = local_98._16_8_;
    ((_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)
    (puVar18 + 1))->super__Head_base<0UL,_xemmai::ast::t_node_*,_false> =
         (_Head_base<0UL,_xemmai::ast::t_node_*,_false>)local_98._0_8_;
    puVar18[2] = local_98._8_8_;
    ppuVar22 = &PTR__t_return_0019ae48;
    goto LAB_0016826f;
  case c_token__THROW:
    local_98._16_8_ = (this_02->v_lexer).v_at.v_column;
    local_98._0_8_ = ptVar1->v_position;
    local_98._8_8_ = (this_02->v_lexer).v_at.v_line;
    t_lexer::f_next((t_lexer *)this_03);
    f_expression((t_parser *)&stack0xffffffffffffff58);
    puVar18 = (undefined8 *)operator_new(0x28);
    puVar18[3] = local_98._16_8_;
    ((tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> *)(puVar18 + 1))->
    super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_> =
         (_Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)
         local_98._0_8_;
    puVar18[2] = local_98._8_8_;
    ppuVar22 = &PTR__t_throw_0019ae90;
LAB_0016826f:
    *puVar18 = ppuVar22;
    puVar18[4] = in_stack_ffffffffffffff58;
    goto LAB_0016827a;
  }
  *puVar18 = ppuVar22;
LAB_0016827a:
  *(undefined8 **)this = puVar18;
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(tuple<xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>)this;
}

Assistant:

std::unique_ptr<ast::t_node> t_parser::f_target(bool a_assignable)
{
	t_at at = v_lexer.f_at();
	switch (v_lexer.f_token()) {
	case t_lexer::c_token__COLON:
	case t_lexer::c_token__SYMBOL:
	case t_lexer::c_token__SELF:
		{
			size_t outer = 0;
			auto scope = v_scope;
			if (v_lexer.f_token() == t_lexer::c_token__COLON) {
				outer = v_lexer.f_integer();
				for (size_t i = 0; i < outer; ++i) {
					if (!scope) f_throw(L"no more outer scope."sv);
					scope = scope->v_outer;
				}
				v_lexer.f_next();
			}
			switch (v_lexer.f_token()) {
			case t_lexer::c_token__SYMBOL:
				{
					auto symbol = f_symbol();
					v_lexer.f_next();
					if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
						if (!a_assignable) f_throw(L"can not assign to expression."sv);
						if (!scope) f_throw(L"no more outer scope."sv);
						v_lexer.f_next();
						auto& variable = f_variable(scope, symbol);
						if (outer > 0) variable.v_shared = variable.v_varies = true;
						return std::make_unique<ast::t_scope_put>(at, outer, variable, f_expression());
					}
					if (scope) (outer > 0 ? scope->v_unresolveds : scope->v_references).insert(symbol);
					return std::make_unique<ast::t_symbol_get>(at, outer, scope, symbol);
				}
			case t_lexer::c_token__SELF:
				{
					if (!scope) f_throw(L"no more outer scope."sv);
					if (outer > 0) scope->v_self_shared = true;
					std::unique_ptr<ast::t_node> target(new ast::t_self(at, outer));
					for (auto c : v_lexer.f_value()) target.reset(c == L'@' ? new ast::t_class(at, std::move(target)) : static_cast<ast::t_node*>(new ast::t_super(at, std::move(target))));
					v_lexer.f_next();
					if (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__SYMBOL) {
						t_at at = v_lexer.f_at();
						auto key = f_symbol();
						v_lexer.f_next();
						if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
							if (!a_assignable) f_throw(L"can not assign to expression."sv);
							v_lexer.f_next();
							return std::make_unique<ast::t_object_put>(at, std::move(target), key, f_expression());
						}
						return std::make_unique<ast::t_object_get>(at, std::move(target), key);
					}
					return target;
				}
			default:
				f_throw(L"expecting symbol or self."sv);
			}
		}
	case t_lexer::c_token__APOSTROPHE:
		v_lexer.f_next();
		switch (v_lexer.f_token()) {
		case t_lexer::c_token__SYMBOL:
			{
				auto symbol = f_symbol();
				v_lexer.f_next();
				return std::make_unique<ast::t_literal<t_object*>>(at, symbol);
			}
		case t_lexer::c_token__LEFT_PARENTHESIS:
			{
				size_t indent = v_lexer.f_indent();
				v_lexer.f_next();
				auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_tuple>()))));
				if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) call->v_expand = f_expressions(indent, call->v_arguments);
				if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_PARENTHESIS) v_lexer.f_next();
				return call;
			}
		default:
			f_throw(L"expecting symbol or '('."sv);
		}
	case t_lexer::c_token__LEFT_PARENTHESIS:
		{
			v_lexer.f_next();
			auto expression = f_expression();
			if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) f_throw(L"expecting ')'."sv);
			v_lexer.f_next();
			return expression;
		}
	case t_lexer::c_token__ATMARK:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto lambda = std::make_unique<ast::t_lambda>(at, v_scope);
			if (!v_lexer.f_newline() && v_lexer.f_token() == t_lexer::c_token__LEFT_PARENTHESIS) {
				v_lexer.f_next();
				if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) {
					while (true) {
						switch (v_lexer.f_token()) {
						case t_lexer::c_token__SYMBOL:
							lambda->v_privates.push_back(&lambda->v_variables.emplace(f_symbol(), t_code::t_variable()).first->second);
							v_lexer.f_next();
							if (v_lexer.f_token() == t_lexer::c_token__EQUAL) {
								v_lexer.f_next();
								lambda->v_defaults.push_back(f_expression());
							} else {
								if (lambda->v_defaults.size() > 0) f_throw(L"expecting '='."sv);
							}
							if (v_lexer.f_newline() && v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) continue;
							if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
								v_lexer.f_next();
								continue;
							}
							break;
						case t_lexer::c_token__ASTERISK:
							v_lexer.f_next();
							if (v_lexer.f_token() != t_lexer::c_token__SYMBOL) f_throw(L"expecting symbol."sv);
							lambda->v_privates.push_back(&lambda->v_variables.emplace(f_symbol(), t_code::t_variable()).first->second);
							lambda->v_variadic = true;
							v_lexer.f_next();
							break;
						default:
							f_throw(L"expecting symbol or '*'."sv);
						}
						break;
					}
					if (v_lexer.f_token() != t_lexer::c_token__RIGHT_PARENTHESIS) f_throw(L"expecting ')'."sv);
				}
				v_lexer.f_next();
			}
			lambda->v_arguments = lambda->v_variables.size();
			v_scope->v_shared = true;
			v_scope = lambda.get();
			bool can_jump = v_can_jump;
			bool can_return = v_can_return;
			v_can_return = true;
			if (v_lexer.f_newline()) {
				if (v_lexer.f_indent() > indent) f_block(lambda->v_block);
			} else {
				lambda->v_block.push_back(f_expression());
				if (v_lexer.f_newline() && v_lexer.f_indent() > indent) f_throw(L"unexpected indent."sv);
			}
			for (auto symbol : lambda->v_unresolveds) {
				auto i = lambda->v_variables.find(symbol);
				if (i == lambda->v_variables.end())
					lambda->v_outer->v_unresolveds.insert(symbol);
				else
					i->second.v_shared = true;
			}
			for (auto symbol : lambda->v_references) {
				auto i = lambda->v_variables.find(symbol);
				if (i == lambda->v_variables.end()) lambda->v_outer->v_unresolveds.insert(symbol);
			}
			v_scope = lambda->v_outer;
			v_can_jump = can_jump;
			v_can_return = can_return;
			std::vector<t_code::t_variable*> variables;
			variables.swap(lambda->v_privates);
			if (lambda->v_self_shared) ++lambda->v_shareds;
			auto i = variables.begin();
			for (auto j = i + lambda->v_arguments; i != j; ++i) {
				t_code::t_variable* p = *i;
				p->v_index = p->v_shared ? lambda->v_shareds++ : lambda->v_privates.size();
				lambda->v_privates.push_back(p);
			}
			for (; i != variables.end(); ++i) {
				t_code::t_variable* p = *i;
				if (p->v_shared) {
					p->v_index = lambda->v_shareds++;
				} else {
					p->v_index = lambda->v_privates.size();
					lambda->v_privates.push_back(p);
				}
			}
			return lambda;
		}
	case t_lexer::c_token__LEFT_BRACKET:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_list>()))));
			if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_BRACKET) call->v_expand = f_expressions(indent, call->v_arguments);
			if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_BRACKET) v_lexer.f_next();
			return call;
		}
	case t_lexer::c_token__LEFT_BRACE:
		{
			size_t indent = v_lexer.f_indent();
			v_lexer.f_next();
			auto call = std::make_unique<ast::t_call>(at, std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(t_object::f_of(f_global()->f_type<t_map>()))));
			if ((!v_lexer.f_newline() || v_lexer.f_indent() > indent) && v_lexer.f_token() != t_lexer::c_token__RIGHT_BRACE)
				while (true) {
					call->v_arguments.push_back(f_expression());
					if (!f_single_colon()) f_throw(L"expecting ':'."sv);
					v_lexer.f_next();
					call->v_arguments.push_back(f_expression());
					if (v_lexer.f_token() == t_lexer::c_token__COMMA) {
						if (v_lexer.f_newline() && v_lexer.f_indent() < indent) break;
						v_lexer.f_next();
						continue;
					}
					if (!v_lexer.f_newline() || v_lexer.f_indent() <= indent) break;
				}
			if ((!v_lexer.f_newline() || v_lexer.f_indent() >= indent) && v_lexer.f_token() == t_lexer::c_token__RIGHT_BRACE) v_lexer.f_next();
			return call;
		}
	case t_lexer::c_token__NULL:
		v_lexer.f_next();
		return std::make_unique<ast::t_null>(at);
	case t_lexer::c_token__TRUE:
		v_lexer.f_next();
		return std::make_unique<ast::t_literal<bool>>(at, true);
	case t_lexer::c_token__FALSE:
		v_lexer.f_next();
		return std::make_unique<ast::t_literal<bool>>(at, false);
	case t_lexer::c_token__INTEGER:
		{
			auto value = v_lexer.f_integer();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<intptr_t>>(at, value);
		}
	case t_lexer::c_token__FLOAT:
		{
			auto value = v_lexer.f_float();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<double>>(at, value);
		}
	case t_lexer::c_token__STRING:
		{
			auto value = v_lexer.f_string();
			v_lexer.f_next();
			return std::make_unique<ast::t_literal<t_object*>>(at, v_module.f_slot(value));
		}
	case t_lexer::c_token__BREAK:
		{
			t_at at = v_lexer.f_at();
			if (!v_can_jump) f_throw(L"expecting inside loop."sv, at);
			v_lexer.f_next();
			return std::make_unique<ast::t_break>(at, f_end_of_expression() ? nullptr : f_expression());
		}
	case t_lexer::c_token__CONTINUE:
		{
			t_at at = v_lexer.f_at();
			if (!v_can_jump) f_throw(L"expecting inside loop."sv, at);
			v_lexer.f_next();
			return std::make_unique<ast::t_continue>(at);
		}
	case t_lexer::c_token__RETURN:
		{
			if (!v_can_return) f_throw(L"expecting within lambda."sv);
			t_at at = v_lexer.f_at();
			v_lexer.f_next();
			return std::make_unique<ast::t_return>(at, f_end_of_expression() ? nullptr : f_expression());
		}
	case t_lexer::c_token__THROW:
		{
			t_at at = v_lexer.f_at();
			v_lexer.f_next();
			return std::make_unique<ast::t_throw>(at, f_expression());
		}
	default:
		f_throw(L"unexpected token."sv);
	}
}